

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  uint64_t uVar1;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StructSchema union1g;
  DebugComparison<const_char_(&)[7],_capnp::Text::Reader> _kjCondition_1;
  DebugComparison<capnp::StructSchema_&,_capnp::Schema> _kjCondition;
  int local_f0;
  undefined4 uStack_ec;
  StructSchema schema;
  ArrayPtr<const_char> local_c8;
  char *local_b8;
  Field u1f0s8;
  Field union1;
  
  _kjCondition_1.left = (char (*) [7])(schemas::s_f47697362233ce52 + 0x48);
  schema = Schema::asStruct((Schema *)&_kjCondition_1);
  name.content.size_ = 5;
  name.content.ptr = "bit0";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name);
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected schema.findFieldByName(\"bit0\") != kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f0s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&schema,name_00);
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == kj::none\", _kjCondition"
               ,(char (*) [62])"failed: expected schema.findFieldByName(\"u1f0s8\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_01.content.size_ = 7;
  name_01.content.ptr = "union1";
  StructSchema::getFieldByName(&union1,&schema,name_01);
  if (union1.proto._reader.dataSize < 0xc0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint64_t *)((long)union1.proto._reader.data + 0x10);
  }
  _kjCondition_1.left = (char (*) [7])Schema::getDependency(&schema.super_Schema,uVar1);
  union1g = Schema::asStruct((Schema *)&_kjCondition_1);
  Schema::getProto((Reader *)&_kjCondition_1,&union1g.super_Schema);
  if ((uint)_kjCondition_1.op.content.size_ < 0xc0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint64_t *)(_kjCondition_1.right.super_StringPtr.content.size_ + 0x10);
  }
  _kjCondition.right = Schema::getDependency(&union1g.super_Schema,uVar1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = schema.super_Schema.raw == (Schema)_kjCondition.right.raw;
  _kjCondition.left = (StructSchema *)&schema.super_Schema;
  if ((schema.super_Schema.raw != (Schema)_kjCondition.right.raw) && (kj::_::Debug::minSeverity < 3)
     ) {
    Schema::getProto((Reader *)&_kjCondition_1,&union1g.super_Schema);
    if ((uint)_kjCondition_1.op.content.size_ < 0xc0) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)(_kjCondition_1.right.super_StringPtr.content.size_ + 0x10);
    }
    u1f0s8.parent.super_Schema = Schema::getDependency(&union1g.super_Schema,uVar1);
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<capnp::StructSchema&,capnp::Schema>&,capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", _kjCondition, schema, union1g.getDependency(union1g.getProto().getScopeId())"
               ,(char (*) [86])
                "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
               ,&_kjCondition,(StructSchema *)&schema.super_Schema,(Schema *)&u1f0s8);
  }
  name_02.content.size_ = 5;
  name_02.content.ptr = "bin0";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_02)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected union1g.findFieldByName(\"bin0\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f0s8";
  StructSchema::getFieldByName(&u1f0s8,&union1g,name_03);
  local_b8 = "u1f0s8";
  _kjCondition._32_8_ = u1f0s8.proto._reader._32_8_;
  local_f0 = u1f0s8.proto._reader.nestingLimit;
  uStack_ec = u1f0s8.proto._reader._44_4_;
  _kjCondition.op.content.ptr = (char *)u1f0s8.proto._reader.data;
  _kjCondition.op.content.size_ = (size_t)u1f0s8.proto._reader.pointers;
  _kjCondition.left = (StructSchema *)u1f0s8.proto._reader.segment;
  _kjCondition.right.raw = (RawBrandedSchema *)u1f0s8.proto._reader.capTable;
  local_c8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&_kjCondition);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[7]> *)&local_b8,(Reader *)&local_c8);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition_1.result == false) {
    _kjCondition._32_8_ = u1f0s8.proto._reader._32_8_;
    local_f0 = u1f0s8.proto._reader.nestingLimit;
    uStack_ec = u1f0s8.proto._reader._44_4_;
    _kjCondition.op.content.ptr = (char *)u1f0s8.proto._reader.data;
    _kjCondition.op.content.size_ = (size_t)u1f0s8.proto._reader.pointers;
    _kjCondition.left = (StructSchema *)u1f0s8.proto._reader.segment;
    _kjCondition.right.raw = (RawBrandedSchema *)u1f0s8.proto._reader.capTable;
    local_c8 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)&_kjCondition);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", _kjCondition, \"u1f0s8\", u1f0s8.getProto().getName()"
               ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
               &_kjCondition_1,(char (*) [7])"u1f0s8",(Reader *)&local_c8);
  }
  _kjCondition_1.left = (char (*) [7])u1f0s8.parent.super_Schema.raw;
  _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition_1.op.content.ptr = &DAT_00000005;
  _kjCondition_1.op.content.size_ =
       CONCAT71(_kjCondition_1.op.content.size_._1_7_,
                u1f0s8.parent.super_Schema.raw == union1g.super_Schema.raw);
  _kjCondition_1.right.super_StringPtr.content.ptr = (char *)&union1g;
  if ((u1f0s8.parent.super_Schema.raw != union1g.super_Schema.raw) &&
     (_kjCondition_1.right.super_StringPtr.content.ptr = (char *)&union1g,
     kj::_::Debug::minSeverity < 3)) {
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)&union1g;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\", _kjCondition",
               (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g",
               (DebugComparison<capnp::StructSchema,_capnp::StructSchema_&> *)&_kjCondition_1);
  }
  name_04.content.size_ = 7;
  name_04.content.ptr = "u1f1s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_04)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s8\") != kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_05.content.size_ = 8;
  name_05.content.ptr = "u1f0s32";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_05)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[64],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != kj::none\", _kjCondition"
               ,(char (*) [64])"failed: expected union1g.findFieldByName(\"u1f0s32\") != kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u1f0sp";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_06)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0sp\") != kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "u1f1s1";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_07)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7d,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u1f1s1\") != kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "u0f0s1";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_08)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u0f0s1\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "u2f0s8";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_09)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == kj::none\", _kjCondition"
               ,(char (*) [63])"failed: expected union1g.findFieldByName(\"u2f0s8\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  name_10.content.size_ = 0xc;
  name_10.content.ptr = "noSuchField";
  StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&_kjCondition,&union1g,name_10)
  ;
  if ((char)_kjCondition.left == '\x01') {
    _kjCondition_1._40_8_ = _local_f0;
    _kjCondition_1.op.content.ptr = (char *)_kjCondition.op.content.size_;
    _kjCondition_1.op.content.size_ = _kjCondition._32_8_;
    _kjCondition_1.right.super_StringPtr.content.ptr = (char *)_kjCondition.right.raw;
    _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)_kjCondition.op.content.ptr;
  }
  _kjCondition_1.left = (char (*) [7])CONCAT71(_kjCondition_1.left._1_7_,(char)_kjCondition.left);
  if (((char)_kjCondition.left != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected union1g.findFieldByName(\"noSuchField\") == kj::none",
               (DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> *)
               &_kjCondition_1);
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == kj::none);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == kj::none);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != kj::none);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == kj::none);
}